

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_type_demo.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\n------------- value type graph -------------\n")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  ValueTypeGraphDemo();
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\n------------- pointer type graph -------------\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PointerTypeGraphDemo();
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\n------------- shared pointer type graph -------------\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  std::cout << "\n------------- value type graph -------------\n" << std::endl;
  ValueTypeGraphDemo();

  std::cout << "\n------------- pointer type graph -------------\n"
            << std::endl;
  PointerTypeGraphDemo();

  std::cout << "\n------------- shared pointer type graph -------------\n"
            << std::endl;
  //   SharedPtrTypeGraphDemo();

  return 0;
}